

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Matcher::DoQueryContinue(Matcher *this,uint qcTicks)

{
  Type TVar1;
  RegexPattern **ppRVar2;
  RegexPattern *this_00;
  ScriptContext *this_01;
  ThreadContext *this_02;
  undefined1 local_38 [8];
  AutoCleanup autoCleanup;
  uint now;
  uint before;
  uint qcTicks_local;
  Matcher *this_local;
  
  TVar1 = this->previousQcTime;
  autoCleanup.regexStacks._4_4_ = GetTickCount();
  if (((TVar1 != 0) && (TimePerQc <= autoCleanup.regexStacks._4_4_ - TVar1)) ||
     ((qcTicks & TicksPerQc - 1U) == 0)) {
    this->previousQcTime = autoCleanup.regexStacks._4_4_;
    TraceQueryContinue(autoCleanup.regexStacks._4_4_);
    ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RegexPattern__((WriteBarrierPtr *)this);
    DoQueryContinue(unsigned_int)::AutoCleanup::AutoCleanup(UnifiedRegex::RegexPattern*,UnifiedRegex
    ::Matcher__(local_38,*ppRVar2,this);
    this_00 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    this_01 = RegexPattern::GetScriptContext(this_00);
    this_02 = Js::ScriptContext::GetThreadContext(this_01);
    ThreadContext::CheckScriptInterrupt(this_02);
    DoQueryContinue::AutoCleanup::~AutoCleanup((AutoCleanup *)local_38);
  }
  return;
}

Assistant:

void Matcher::DoQueryContinue(const uint qcTicks)
    {
        // See definition of TimePerQc for description of regex QC heuristics

        const uint before = previousQcTime;
        const uint now = GetTickCount();
        if ((!before || now - before < TimePerQc) && qcTicks & TicksPerQc - 1)
        {
            return;
        }

        previousQcTime = now;
        TraceQueryContinue(now);

        // Query-continue can be reentrant and run the same regex again. To prevent the matcher and other persistent objects
        // from being reused reentrantly, save and restore them around the QC call.
        class AutoCleanup
        {
        private:
            RegexPattern *const pattern;
            Matcher *const matcher;
            RegexStacks * regexStacks;

        public:
            AutoCleanup(RegexPattern *const pattern, Matcher *const matcher) : pattern(pattern), matcher(matcher)
            {
                Assert(pattern);
                Assert(matcher);
                Assert(pattern->rep.unified.matcher == matcher);

                pattern->rep.unified.matcher = nullptr;

                const auto scriptContext = pattern->GetScriptContext();
                regexStacks = scriptContext->SaveRegexStacks();
            }

            ~AutoCleanup()
            {
                pattern->rep.unified.matcher = matcher;

                const auto scriptContext = pattern->GetScriptContext();
                scriptContext->RestoreRegexStacks(regexStacks);
            }
        } autoCleanup(pattern, this);

        pattern->GetScriptContext()->GetThreadContext()->CheckScriptInterrupt();
    }